

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int birthday_cdf_inv(double cdf)

{
  int local_24;
  int n;
  int i;
  double cdf_not;
  double cdf_local;
  
  if (0.0 < cdf) {
    if (cdf < 1.0) {
      _n = 1.0;
      for (local_24 = 1; local_24 < 0x16e; local_24 = local_24 + 1) {
        _n = (_n * (double)(0x16e - local_24)) / 365.0;
        if (cdf <= 1.0 - _n) {
          return local_24;
        }
      }
      cdf_local._4_4_ = 0x16d;
    }
    else {
      cdf_local._4_4_ = 0x16d;
    }
  }
  else {
    cdf_local._4_4_ = 0;
  }
  return cdf_local._4_4_;
}

Assistant:

int birthday_cdf_inv ( double cdf )

//****************************************************************************80
//
//  Purpose:
//
//    BIRTHDAY_CDF_INV inverts the Birthday Concurrence CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 August 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the probability that at least
//    two of the N people have matching birthays..
//
//    Output, int BIRTHDAY_CDF_INV, the corresponding number of people whose
//    birthdays need to be disclosed.
//
{
  double cdf_not;
  int i;
  int n;

  if ( cdf <= 0.0 )
  {
    n = 0;
    return n;
  }
  else if ( 1.0 <= cdf )
  {
    n = 365;
    return n;
  }
//
//  Compute the probability that N people have distinct birthdays.
//
  cdf_not = 1.0;

  for ( i = 1; i <= 365; i++ )
  {
    cdf_not = cdf_not * static_cast<double>(365 + 1 - i ) / 365.0;
    if ( cdf <= 1.0 - cdf_not )
    {
      n = i;
      return n;
    }
  }
  n = 365;
  return n;
}